

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O2

_Bool al_resize_display(ALLEGRO_DISPLAY *display,int width,int height)

{
  _func__Bool_ALLEGRO_DISPLAY_ptr_int_int *UNRECOVERED_JUMPTABLE;
  _Bool _Var1;
  
  _Var1 = _al_trace_prefix("display",1,
                           "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/display.c"
                           ,0xee,"al_resize_display");
  if (_Var1) {
    _al_trace_suffix("Requested display resize %dx%d+%d\n",width,(ulong)(uint)height,
                     (ulong)(uint)display->extra_resize_height);
  }
  UNRECOVERED_JUMPTABLE = display->vt->resize_display;
  if (UNRECOVERED_JUMPTABLE != (_func__Bool_ALLEGRO_DISPLAY_ptr_int_int *)0x0) {
    _Var1 = (*UNRECOVERED_JUMPTABLE)(display,width,height + display->extra_resize_height);
    return _Var1;
  }
  return false;
}

Assistant:

bool al_resize_display(ALLEGRO_DISPLAY *display, int width, int height)
{
   ASSERT(display);
   ASSERT(display->vt);

   ALLEGRO_INFO("Requested display resize %dx%d+%d\n", width, height, display->extra_resize_height);

   if (display->vt->resize_display) {
      return display->vt->resize_display(display, width, height + display->extra_resize_height);
   }
   return false;
}